

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.c
# Opt level: O0

object * objectRead(FILE *fp)

{
  int iVar1;
  object *poVar2;
  long lVar3;
  object *local_40;
  byteObject *bnewObj;
  object *newObj;
  int i;
  int val;
  int size;
  int type;
  FILE *fp_local;
  
  bnewObj = (byteObject *)0x0;
  _size = fp;
  readTag(fp,&val,(int *)((long)&newObj + 4));
  if (val == 0) {
    error_impl("objectRead",0x26b,"objectRead(): Read in a NULL object!");
  }
  else if (val == 0x20) {
    i = newObj._4_4_;
    memoryPointer = (object *)((long)&memoryPointer->header + (long)(int)((newObj._4_4_ + 2) * -8));
    if ((long)memoryPointer < (long)memoryBase) {
      local_40 = gcollect(newObj._4_4_);
    }
    else {
      memoryPointer->header = (ulong)(newObj._4_4_ << 2);
      local_40 = memoryPointer;
    }
    bnewObj = (byteObject *)local_40;
    lVar3 = (long)indirtop;
    indirtop = indirtop + 1;
    indirArray[lVar3] = local_40;
    poVar2 = objectRead(_size);
    local_40->class = poVar2;
    for (newObj._0_4_ = 0; (int)newObj < i; newObj._0_4_ = (int)newObj + 1) {
      poVar2 = objectRead(_size);
      (&local_40[1].header)[(int)newObj] = (uintptr_t)poVar2;
    }
  }
  else if (val == 0x40) {
    bnewObj = (byteObject *)((long)(int)newObj._4_4_ << 1 | 1);
  }
  else if (val == 0x60) {
    bnewObj = (byteObject *)((long)(int)-newObj._4_4_ << 1 | 1);
  }
  else if (val == 0x80) {
    i = newObj._4_4_;
    bnewObj = (byteObject *)gcialloc(newObj._4_4_);
    lVar3 = (long)indirtop;
    indirtop = indirtop + 1;
    indirArray[lVar3] = (object *)bnewObj;
    for (newObj._0_4_ = 0; (int)newObj < i; newObj._0_4_ = (int)newObj + 1) {
      iVar1 = get_byte(_size);
      *(char *)((long)&((object *)bnewObj)[1].header + (long)(int)newObj) = (char)iVar1;
    }
    poVar2 = objectRead(_size);
    ((object *)bnewObj)->class = poVar2;
  }
  else if (val == 0xa0) {
    if (indirtop < (int)newObj._4_4_) {
      error_impl("objectRead",0x294,"Illegal previous object index %d (max %d)!",(ulong)newObj._4_4_
                 ,(ulong)(uint)indirtop);
    }
    bnewObj = (byteObject *)indirArray[(int)newObj._4_4_];
  }
  else if (val == 0xc0) {
    bnewObj = (byteObject *)*indirArray;
  }
  else {
    error_impl("objectRead",0x2a0,"Illegal tag type %d!",(ulong)(uint)val);
  }
  return (object *)bnewObj;
}

Assistant:

struct object *objectRead(FILE *fp)
{
    int type;
    int size;
    int val;
    int i;
    struct object *newObj=(struct object *)0;
    struct byteObject *bnewObj;

    /* get the tag header for the object, this has a type and value */
    readTag(fp,&type,&val);

    switch(type) {
    case LST_ERROR_TYPE:    /* nil obj */
        error("objectRead(): Read in a NULL object!");

        break;

    case LST_OBJ_TYPE:  /* ordinary object */
        size = val;
        newObj = gcalloc(size);
        indirArray[indirtop++] = newObj;
        newObj->class = objectRead(fp);

        /* get object field values. */
        for (i = 0; i < size; i++) {
            newObj->data[i] = objectRead(fp);
        }

        break;

    case LST_PINT_TYPE: /* positive integer */
        newObj = newInteger(val);
        break;

    case LST_NINT_TYPE: /* negative integer */
        newObj = newInteger(-val);
        break;

    case LST_BARRAY_TYPE:   /* byte arrays */
        size = val;
//        newObj = staticIAllocate(size);
        newObj = gcialloc(size);
        indirArray[indirtop++] = newObj;
        bnewObj = (struct byteObject *) newObj;
        for (i = 0; i < size; i++) {
            /* FIXME check for EOF! */
            bnewObj->bytes[i] = (uint8_t)get_byte(fp);
        }

        bnewObj->class = objectRead(fp);
        break;

    case LST_POBJ_TYPE: /* previous object */
        if(val>indirtop) {
            error("Illegal previous object index %d (max %d)!",val, indirtop);
        }

        newObj = indirArray[val];

        break;

    case LST_NIL_TYPE:  /* object 0 (nil object) */
        newObj = indirArray[0];
        break;

    default:
        error("Illegal tag type %d!",type);
        break;
    }

    return newObj;
}